

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_callback_helper.h
# Opt level: O2

void __thiscall
miniros::
SubscriptionCallbackHelperT<const_miniros::MessageEvent<const_miniros::topic_tools::ShapeShifter>_&,_void>
::call(SubscriptionCallbackHelperT<const_miniros::MessageEvent<const_miniros::topic_tools::ShapeShifter>_&,_void>
       *this,SubscriptionCallbackHelperCallParams *params)

{
  Event event;
  MessageEvent<const_miniros::topic_tools::ShapeShifter> local_70;
  
  MessageEvent<const_miniros::topic_tools::ShapeShifter>::MessageEvent
            (&local_70,&params->event,&this->create_);
  std::function<void_(const_miniros::MessageEvent<const_miniros::topic_tools::ShapeShifter>_&)>::
  operator()(&this->callback_,&local_70);
  MessageEvent<const_miniros::topic_tools::ShapeShifter>::~MessageEvent(&local_70);
  return;
}

Assistant:

virtual void call(SubscriptionCallbackHelperCallParams& params)
  {
    Event event(params.event, create_);
    callback_(ParameterAdapter<P>::getParameter(event));
  }